

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::FormatArg::formatImpl<char[30]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (fmtEnd[-1] == 'p') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::ostream::_M_insert<void_const*>(out);
      return;
    }
  }
  else if (ntrunc < 0) {
    sVar2 = strlen((char *)value);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)value,sVar2);
      return;
    }
  }
  else {
    if (ntrunc != 0) {
      uVar3 = 0;
      do {
        if (*(char *)((long)value + uVar3) == '\0') break;
        uVar3 = uVar3 + 1;
      } while ((uint)ntrunc != uVar3);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::ostream::write((char *)out,(long)value);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }